

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O3

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_accept_op_base<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>,_std::experimental::net::v1::ip::tcp>
       ::do_perform(reactor_op *base)

{
  int __fd;
  int iVar1;
  sockaddr *__addr;
  int iVar2;
  ulong in_RAX;
  int *piVar3;
  error_category *peVar4;
  status sVar5;
  undefined8 uStack_38;
  
  __fd = *(int *)&base[1].super_operation.next_;
  if (__fd == -1) {
    uStack_38 = in_RAX;
    peVar4 = (error_category *)::std::_V2::system_category();
    (base->ec_)._M_value = 9;
    (base->ec_)._M_cat = peVar4;
    goto LAB_00117cf5;
  }
  uStack_38._4_4_ = (undefined4)(in_RAX >> 0x20);
  uStack_38._0_4_ = CONCAT13(*(undefined1 *)((long)&base[1].super_operation.next_ + 4),(int3)in_RAX)
  ;
  __addr = (sockaddr *)base[1].ec_._M_cat;
  piVar3 = __errno_location();
  do {
    *piVar3 = 0;
    if (__addr == (sockaddr *)0x0) {
      iVar2 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
    }
    else {
      uStack_38 = CONCAT44((int)base[1].bytes_transferred_,(undefined4)uStack_38);
      iVar2 = accept(__fd,__addr,(socklen_t *)((long)&uStack_38 + 4));
      base[1].bytes_transferred_ = uStack_38 >> 0x20;
    }
    iVar1 = *piVar3;
    peVar4 = (error_category *)::std::_V2::system_category();
    (base->ec_)._M_value = iVar1;
    (base->ec_)._M_cat = peVar4;
    if (iVar2 != -1) {
      (base->ec_)._M_value = 0;
      sVar5 = done;
      goto LAB_00117d27;
    }
  } while (iVar1 == 4);
  if (iVar1 != 0xb) {
    if (iVar1 == 0x67) {
      if ((uStack_38 & 0x4000000) != 0) {
LAB_00117cf5:
        sVar5 = done;
        goto LAB_00117d21;
      }
    }
    else if ((uStack_38 & 0x4000000) != 0 || iVar1 != 0x47) goto LAB_00117cf5;
  }
  sVar5 = not_done;
LAB_00117d21:
  iVar2 = -1;
LAB_00117d27:
  socket_holder::reset((socket_holder *)&base[1].super_operation.func_);
  *(int *)&base[1].super_operation.func_ = iVar2;
  return sVar5;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_accept_op_base* o(
        static_cast<reactive_socket_accept_op_base*>(base));

    socket_type new_socket = invalid_socket;
    status result = socket_ops::non_blocking_accept(o->socket_,
        o->state_, o->peer_endpoint_ ? o->peer_endpoint_->data() : 0,
        o->peer_endpoint_ ? &o->addrlen_ : 0, o->ec_, new_socket)
    ? done : not_done;
    o->new_socket_.reset(new_socket);

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_accept", o->ec_));

    return result;
  }